

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjEncodeYUV(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelSize,
               uchar *dstBuf,int subsamp,int flags)

{
  int iVar1;
  uint pixelFormat;
  
  if (pixelSize == 1) {
    pixelFormat = 6;
  }
  else if (pixelSize == 4) {
    if ((flags & 0x40U) == 0) {
      pixelFormat = flags & 1U | 2;
    }
    else {
      pixelFormat = flags & 1U ^ 5;
    }
  }
  else if (pixelSize == 3) {
    pixelFormat = flags & 1;
  }
  else {
    pixelFormat = 0xffffffff;
  }
  iVar1 = tjEncodeYUV3(handle,srcBuf,width,pitch,height,pixelFormat,dstBuf,4,subsamp,flags);
  return iVar1;
}

Assistant:

DLLEXPORT int tjEncodeYUV(tjhandle handle, unsigned char *srcBuf, int width,
                          int pitch, int height, int pixelSize,
                          unsigned char *dstBuf, int subsamp, int flags)
{
  return tjEncodeYUV2(handle, srcBuf, width, pitch, height,
                      getPixelFormat(pixelSize, flags), dstBuf, subsamp,
                      flags);
}